

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O2

int quicly_recvbuf_receive
              (quicly_stream_t *stream,ptls_buffer_t *rb,size_t off,void *src,size_t len)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 0;
  if (len != 0) {
    uVar1 = len + off;
    iVar2 = ptls_buffer_reserve(rb,uVar1 - rb->off);
    if (iVar2 == 0) {
      memcpy(rb->base + off,src,len);
      iVar2 = 0;
      if (rb->off < uVar1) {
        rb->off = uVar1;
      }
    }
    else {
      convert_error(stream,iVar2);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int quicly_recvbuf_receive(quicly_stream_t *stream, ptls_buffer_t *rb, size_t off, const void *src, size_t len)
{
    if (len != 0) {
        int ret;
        if ((ret = ptls_buffer_reserve(rb, off + len - rb->off)) != 0) {
            convert_error(stream, ret);
            return -1;
        }
        memcpy(rb->base + off, src, len);
        if (rb->off < off + len)
            rb->off = off + len;
    }
    return 0;
}